

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

Time __thiscall
helics::TimeCoordinator::updateTimeBlocks(TimeCoordinator *this,int32_t blockId,Time newTime)

{
  long lVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  pointer ppVar6;
  long lVar7;
  int32_t local_14;
  TimeRepresentation<count_time<9,_long>_> local_10;
  
  ppVar2 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)ppVar3 - (long)ppVar2;
  ppVar4 = ppVar2;
  if (0 < (long)uVar5 >> 6) {
    ppVar4 = (pointer)((long)&(ppVar2->first).internalTimeCode + (uVar5 & 0xffffffffffffffc0));
    lVar7 = ((long)uVar5 >> 6) + 1;
    ppVar6 = ppVar2 + 2;
    do {
      if (ppVar6[-2].second == blockId) {
        ppVar6 = ppVar6 + -2;
        goto LAB_0030c2de;
      }
      if (ppVar6[-1].second == blockId) {
        ppVar6 = ppVar6 + -1;
        goto LAB_0030c2de;
      }
      if (ppVar6->second == blockId) goto LAB_0030c2de;
      if (ppVar6[1].second == blockId) {
        ppVar6 = ppVar6 + 1;
        goto LAB_0030c2de;
      }
      lVar7 = lVar7 + -1;
      ppVar6 = ppVar6 + 4;
    } while (1 < lVar7);
    uVar5 = (long)ppVar3 - (long)ppVar4;
  }
  lVar7 = (long)uVar5 >> 4;
  if (lVar7 == 1) {
LAB_0030c2c2:
    ppVar6 = ppVar4;
    if (ppVar4->second != blockId) {
      ppVar6 = ppVar3;
    }
LAB_0030c2de:
    if (ppVar6 != ppVar3) {
      (ppVar6->first).internalTimeCode = newTime.internalTimeCode;
      goto LAB_0030c30c;
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0030c2b9:
      ppVar6 = ppVar4;
      if (ppVar4->second != blockId) {
        ppVar4 = ppVar4 + 1;
        goto LAB_0030c2c2;
      }
      goto LAB_0030c2de;
    }
    if (lVar7 == 3) {
      ppVar6 = ppVar4;
      if (ppVar4->second != blockId) {
        ppVar4 = ppVar4 + 1;
        goto LAB_0030c2b9;
      }
      goto LAB_0030c2de;
    }
  }
  local_14 = blockId;
  local_10.internalTimeCode = newTime.internalTimeCode;
  std::
  vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>
  ::emplace_back<TimeRepresentation<count_time<9,long>>&,int&>
            ((vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>
              *)&this->timeBlocks,&local_10,&local_14);
  ppVar2 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0030c30c:
  ppVar4 = ppVar2 + 1;
  if (ppVar4 != ppVar3 && ppVar2 != ppVar3) {
    lVar7 = (ppVar2->first).internalTimeCode;
    do {
      lVar1 = (ppVar4->first).internalTimeCode;
      if (lVar1 < lVar7) {
        ppVar2 = ppVar4;
        lVar7 = lVar1;
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar3);
  }
  return (Time)(ppVar2->first).internalTimeCode;
}

Assistant:

Time TimeCoordinator::updateTimeBlocks(int32_t blockId, Time newTime)
{
    auto blk = std::find_if(timeBlocks.begin(), timeBlocks.end(), [blockId](const auto& block) {
        return (block.second == blockId);
    });
    if (blk != timeBlocks.end()) {
        blk->first = newTime;
    } else {
        timeBlocks.emplace_back(newTime, blockId);
    }
    auto res = std::min_element(timeBlocks.begin(),
                                timeBlocks.end(),
                                [](const auto& blk1, const auto& blk2) {
                                    return (blk1.first < blk2.first);
                                });
    return res->first;
}